

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O3

void av1_block_yrd_idtx(MACROBLOCK *x,uint8_t *pred_buf,int pred_stride,RD_STATS *this_rdc,
                       int *skippable,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  byte bVar1;
  byte bVar2;
  MACROBLOCK *pMVar3;
  ulong uVar4;
  int16_t *piVar5;
  int64_t iVar6;
  ushort uVar7;
  uint uVar8;
  int16_t *piVar9;
  long lVar10;
  RD_STATS *pRVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  undefined7 in_register_00000089;
  uint uVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  uint16_t eob [1];
  tran_low_t coeff_buf [256];
  tran_low_t qcoeff_buf [256];
  tran_low_t dqcoeff_buf [256];
  int local_d00;
  ushort local_cfa;
  RD_STATS *local_cf8;
  MACROBLOCK *local_cf0;
  int local_ce4;
  int local_ce0;
  int local_cdc;
  int local_cd8;
  int local_cd4;
  int *local_cd0;
  ulong local_cc8;
  SCAN_ORDER *local_cc0;
  long local_cb8;
  long local_cb0;
  ulong local_ca8;
  ulong local_ca0;
  long local_c98;
  ulong local_c90;
  long local_c88;
  int16_t local_c80 [512];
  ushort local_880 [512];
  int16_t local_480 [552];
  
  uVar4 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  local_cc8 = (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [uVar4];
  iVar12 = 1 << (tx_size & 0x1f);
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar4];
  local_d00 = 1;
  iVar17 = (x->e_mbd).mb_to_bottom_edge;
  uVar15 = (iVar17 >> 0x1f & iVar17 >> 5) + (uint)bVar2;
  uVar8 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar4]
          * 4;
  bVar1 = tx_size - 1;
  if (bVar1 < 4) {
    local_cc0 = (SCAN_ORDER *)(&PTR_av1_fast_idtx_scan_order_8x8_005daca0)[bVar1];
    iVar17 = *(int *)(&DAT_0050d7d0 + (ulong)bVar1 * 4);
  }
  else {
    iVar17 = 4;
    local_cc0 = &av1_fast_idtx_scan_order_4x4;
  }
  iVar16 = (x->e_mbd).mb_to_right_edge;
  this_rdc->dist = 0;
  this_rdc->rate = 0;
  local_cf8 = this_rdc;
  local_cf0 = x;
  local_cd0 = skippable;
  (*aom_subtract_block)
            ((uint)bVar2 << 2,uVar8,x->plane[0].src_diff,(ulong)uVar8,x->plane[0].src.buf,
             (long)x->plane[0].src.stride,pred_buf,(long)pred_stride);
  if ((int)uVar15 < 1) {
    iVar12 = 0;
  }
  else {
    local_cb0 = (long)(iVar16 >> 0x1f & iVar16 >> 5) + local_cc8;
    local_c90 = (ulong)(uint)(iVar17 * iVar17);
    local_ca8 = (ulong)(uint)(0x10 << (tx_size * '\x02' & 0x1f));
    local_cb8 = (long)iVar12;
    local_ca0 = (ulong)uVar15;
    local_ce4 = iVar12 * (int)local_cc8 * 0x10;
    local_cdc = iVar12 * 4;
    uVar4 = (ulong)(uint)((int)local_cc8 << 3);
    local_d00 = 1;
    iVar16 = 0;
    local_c98 = 0;
    iVar12 = 0;
    pRVar11 = local_cf8;
    local_cd8 = iVar17;
    do {
      local_ce0 = iVar16;
      if (0 < (int)local_cb0) {
        local_c88 = local_c98 * local_cc8;
        lVar13 = 0;
        do {
          pMVar3 = local_cf0;
          piVar5 = local_cf0->plane[0].src_diff;
          if (iVar17 == 4) {
            piVar5 = piVar5 + iVar16;
            piVar9 = local_c80;
            lVar10 = 0;
            do {
              lVar14 = 0;
              do {
                piVar9[lVar14] = piVar5[lVar14] << 3;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 4);
              lVar10 = lVar10 + 1;
              piVar9 = piVar9 + 4;
              piVar5 = (int16_t *)((long)piVar5 + uVar4);
            } while (lVar10 != 4);
          }
          else if (iVar17 == 8) {
            piVar5 = piVar5 + iVar16;
            piVar9 = local_c80;
            lVar10 = 0;
            do {
              lVar14 = 0;
              do {
                piVar9[lVar14] = piVar5[lVar14] << 3;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 8);
              lVar10 = lVar10 + 1;
              piVar9 = piVar9 + 8;
              piVar5 = (int16_t *)((long)piVar5 + uVar4);
            } while (lVar10 != 8);
          }
          else if (iVar17 == 0x10) {
            piVar5 = piVar5 + iVar16;
            piVar9 = local_c80;
            lVar10 = 0;
            do {
              lVar14 = 0;
              do {
                piVar9[lVar14] = piVar5[lVar14] << 3;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0x10);
              lVar10 = lVar10 + 1;
              piVar9 = piVar9 + 0x10;
              piVar5 = (int16_t *)((long)piVar5 + uVar4);
            } while (lVar10 != 0x10);
          }
          local_cd4 = iVar12;
          (*av1_quantize_lp)(local_c80,local_c90,local_cf0->plane[0].round_fp_QTX,
                             local_cf0->plane[0].quant_fp_QTX,(int16_t *)local_880,local_480,
                             local_cf0->plane[0].dequant_QTX,&local_cfa,local_cc0->scan,
                             local_cc0->iscan);
          bVar18 = local_cfa == 0;
          if (!bVar18) {
            local_d00 = 0;
          }
          (pMVar3->txfm_search_info).blk_skip[lVar13 + local_c88] = bVar18;
          uVar8 = (uint)local_cfa;
          if (!bVar18) {
            if (uVar8 == 1) {
              uVar7 = -local_880[0];
              if (0 < (short)local_880[0]) {
                uVar7 = local_880[0];
              }
              uVar15 = (uint)uVar7;
            }
            else {
              uVar15 = (*aom_satd_lp)((int16_t *)local_880,(int)local_ca8);
            }
            local_cf8->rate = local_cf8->rate + uVar15;
          }
          uVar8 = uVar8 + 1;
          iVar12 = 0x1f;
          if (uVar8 != 0) {
            for (; uVar8 >> iVar12 == 0; iVar12 = iVar12 + -1) {
            }
          }
          iVar12 = local_cd4 + iVar12;
          iVar6 = (*av1_block_error_lp)(local_c80,local_480,local_ca8);
          local_cf8->dist = local_cf8->dist + (iVar6 >> 2);
          lVar13 = lVar13 + local_cb8;
          iVar16 = iVar16 + local_cdc;
          pRVar11 = local_cf8;
          iVar17 = local_cd8;
        } while (lVar13 < local_cb0);
      }
      local_c98 = local_c98 + local_cb8;
      iVar16 = local_ce0 + local_ce4;
    } while (local_c98 < (long)local_ca0);
    iVar12 = iVar12 << 9;
    local_cf8 = pRVar11;
  }
  *local_cd0 = local_d00;
  local_cf8->skip_txfm = (uint8_t)local_d00;
  if (local_cf8->sse != 0x7fffffffffffffff) {
    lVar13 = (local_cf8->sse << 6) >> 2;
    local_cf8->sse = lVar13;
    if (local_d00 != 0) {
      local_cf8->dist = lVar13;
      return;
    }
  }
  local_cf8->rate = local_cf8->rate * 0x800 + iVar12;
  return;
}

Assistant:

void av1_block_yrd_idtx(MACROBLOCK *x, const uint8_t *const pred_buf,
                        int pred_stride, RD_STATS *this_rdc, int *skippable,
                        BLOCK_SIZE bsize, TX_SIZE tx_size) {
  MACROBLOCKD *xd = &x->e_mbd;
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  assert(bsize < BLOCK_SIZES_ALL);
  const int num_4x4_w = mi_size_wide[bsize];
  const int num_4x4_h = mi_size_high[bsize];
  const int step = 1 << (tx_size << 1);
  const int block_step = (1 << tx_size);
  const int max_blocks_wide =
      num_4x4_w + (xd->mb_to_right_edge >= 0 ? 0 : xd->mb_to_right_edge >> 5);
  const int max_blocks_high =
      num_4x4_h + (xd->mb_to_bottom_edge >= 0 ? 0 : xd->mb_to_bottom_edge >> 5);
  int eob_cost = 0;
  const int bw = 4 * num_4x4_w;
  const int bh = 4 * num_4x4_h;
  const int num_blk_skip_w = num_4x4_w;
  // Keep the intermediate value on the stack here. Writing directly to
  // skippable causes speed regression due to load-and-store issues in
  // update_yrd_loop_vars.
  int temp_skippable = 1;
  int tx_wd = 0;
  const SCAN_ORDER *scan_order = NULL;
  switch (tx_size) {
    case TX_64X64:
      assert(0);  // Not implemented
      break;
    case TX_32X32:
      assert(0);  // Not used
      break;
    case TX_16X16:
      scan_order = &av1_fast_idtx_scan_order_16x16;
      tx_wd = 16;
      break;
    case TX_8X8:
      scan_order = &av1_fast_idtx_scan_order_8x8;
      tx_wd = 8;
      break;
    default:
      assert(tx_size == TX_4X4);
      scan_order = &av1_fast_idtx_scan_order_4x4;
      tx_wd = 4;
      break;
  }
  assert(scan_order != NULL);

  this_rdc->dist = 0;
  this_rdc->rate = 0;
  aom_subtract_block(bh, bw, p->src_diff, bw, p->src.buf, p->src.stride,
                     pred_buf, pred_stride);
  // Keep track of the row and column of the blocks we use so that we know
  // if we are in the unrestricted motion border.
  DECLARE_BLOCK_YRD_BUFFERS()
  DECLARE_BLOCK_YRD_VARS()
  for (int r = 0; r < max_blocks_high; r += block_step) {
    for (int c = 0, s = 0; c < max_blocks_wide; c += block_step, s += step) {
      DECLARE_LOOP_VARS_BLOCK_YRD()
      scale_square_buf_vals(low_coeff, tx_wd, src_diff, diff_stride);
      av1_quantize_lp(low_coeff, tx_wd * tx_wd, p->round_fp_QTX,
                      p->quant_fp_QTX, low_qcoeff, low_dqcoeff, p->dequant_QTX,
                      eob, scan_order->scan, scan_order->iscan);
      assert(*eob <= 1024);
      update_yrd_loop_vars(x, &temp_skippable, step, *eob, low_coeff,
                           low_qcoeff, low_dqcoeff, this_rdc, &eob_cost,
                           r * num_blk_skip_w + c);
    }
  }
  this_rdc->skip_txfm = *skippable = temp_skippable;
  if (this_rdc->sse < INT64_MAX) {
    this_rdc->sse = (this_rdc->sse << 6) >> 2;
    if (temp_skippable) {
      this_rdc->dist = 0;
      this_rdc->dist = this_rdc->sse;
      return;
    }
  }
  // If skippable is set, rate gets clobbered later.
  this_rdc->rate <<= (2 + AV1_PROB_COST_SHIFT);
  this_rdc->rate += (eob_cost << AV1_PROB_COST_SHIFT);
}